

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O3

void __thiscall Num3072::Multiply(Num3072 *this,Num3072 *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int i_2;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int i_1;
  int j;
  ulong uVar19;
  ulong uVar20;
  limb_t *plVar21;
  long lVar22;
  ulong uVar23;
  limb_t *plVar24;
  ulong uVar25;
  ulong uVar26;
  limb_t *plVar27;
  long lVar28;
  long in_FS_OFFSET;
  bool bVar29;
  Num3072 tmp;
  ulong local_1b8;
  undefined1 local_1b0 [368];
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b8 = 1;
  memset(local_1b0,0,0x170);
  uVar18 = a->limbs[0x2f];
  plVar27 = this->limbs + 2;
  lVar28 = 1;
  uVar15 = 0;
  local_40 = 0;
  plVar21 = a->limbs;
  uVar20 = 0;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar18;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = this->limbs[uVar20 + 1];
    auVar12 = auVar1 * auVar8;
    if (uVar20 < 0x2e) {
      uVar26 = 0x2e;
      lVar22 = 0;
      plVar24 = plVar27;
      do {
        uVar23 = auVar12._8_8_;
        uVar25 = auVar12._0_8_;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = a->limbs[uVar26];
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *plVar24;
        uVar19 = SUB168(auVar2 * auVar9,8);
        uVar14 = SUB168(auVar2 * auVar9,0);
        uVar17 = (ulong)CARRY8(uVar25,uVar14);
        uVar16 = uVar23 + uVar19;
        auVar12._8_8_ = uVar16 + uVar17;
        auVar12._0_8_ = uVar25 + uVar14;
        lVar22 = lVar22 + (ulong)(CARRY8(uVar23,uVar19) || CARRY8(uVar16,uVar17));
        uVar26 = uVar26 - 1;
        plVar24 = plVar24 + 1;
      } while (uVar20 != uVar26);
      lVar22 = lVar22 * 0x10d765;
    }
    else {
      lVar22 = 0;
    }
    auVar13._8_8_ = lVar22;
    auVar13._0_8_ = uVar15;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar12._0_8_;
    uVar14 = SUB168(auVar3 * ZEXT816(0x10d765),8);
    uVar15 = SUB168(auVar3 * ZEXT816(0x10d765),0);
    uVar26 = uVar20 + 1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = auVar12._8_8_;
    auVar13 = auVar4 * ZEXT816(0x10d765) + auVar13;
    uVar16 = auVar13._0_8_;
    uVar19 = uVar15 + local_40;
    uVar15 = (ulong)CARRY8(uVar15,local_40);
    uVar17 = uVar16 + uVar14;
    local_40 = uVar17 + uVar15;
    uVar15 = auVar13._8_8_ + (ulong)(CARRY8(uVar16,uVar14) || CARRY8(uVar17,uVar15));
    lVar22 = 0;
    plVar24 = plVar21;
    do {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *plVar24;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = this->limbs[lVar22];
      uVar16 = SUB168(auVar5 * auVar10,8);
      uVar17 = SUB168(auVar5 * auVar10,0);
      bVar29 = CARRY8(uVar19,uVar17);
      uVar19 = uVar19 + uVar17;
      uVar17 = (ulong)bVar29;
      bVar29 = CARRY8(local_40,uVar16);
      uVar16 = local_40 + uVar16;
      local_40 = uVar16 + uVar17;
      uVar15 = uVar15 + (bVar29 || CARRY8(uVar16,uVar17));
      lVar22 = lVar22 + 1;
      plVar24 = plVar24 + -1;
    } while (lVar28 != lVar22);
    *(ulong *)(local_1b0 + uVar20 * 8 + -8) = uVar19;
    lVar28 = lVar28 + 1;
    plVar27 = plVar27 + 1;
    plVar21 = plVar21 + 1;
    uVar20 = uVar26;
  } while (uVar26 != 0x2f);
  plVar27 = a->limbs + 0x2f;
  lVar22 = 0;
  lVar28 = 0;
  do {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *plVar27;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = this->limbs[lVar22];
    uVar20 = SUB168(auVar6 * auVar11,8);
    uVar18 = SUB168(auVar6 * auVar11,0);
    bVar29 = CARRY8(local_40,uVar18);
    local_40 = local_40 + uVar18;
    uVar18 = (ulong)bVar29;
    bVar29 = CARRY8(uVar15,uVar20);
    uVar20 = uVar15 + uVar20;
    uVar15 = uVar20 + uVar18;
    lVar28 = lVar28 + (ulong)(bVar29 || CARRY8(uVar20,uVar18));
    lVar22 = lVar22 + 1;
    plVar27 = plVar27 + -1;
  } while (lVar22 != 0x30);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar15;
  uVar20 = SUB168(auVar7 * ZEXT816(0x10d765),0);
  uVar18 = lVar28 * 0x10d765 + SUB168(auVar7 * ZEXT816(0x10d765),8);
  lVar28 = 0;
  do {
    bVar29 = CARRY8(uVar20,*(ulong *)(local_1b0 + lVar28 * 8 + -8));
    this->limbs[lVar28] = uVar20 + *(ulong *)(local_1b0 + lVar28 * 8 + -8);
    uVar20 = uVar18 + 1;
    if (!bVar29) {
      uVar20 = uVar18;
    }
    bVar29 = bVar29 && uVar18 + 1 == 0;
    uVar18 = (ulong)bVar29;
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x30);
  if (bVar29) {
    __assert_fail("c1 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/muhash.cpp"
                  ,0xcf,"void Num3072::Multiply(const Num3072 &)");
  }
  if (1 < uVar20) {
    __assert_fail("c0 == 0 || c0 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/muhash.cpp"
                  ,0xd0,"void Num3072::Multiply(const Num3072 &)");
  }
  if (0xffffffffffef289a < this->limbs[0]) {
    lVar28 = 1;
    do {
      if (this->limbs[lVar28] != 0xffffffffffffffff) goto LAB_00df664d;
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0x30);
    uVar18 = 0x10d765;
    lVar28 = 0;
    do {
      plVar27 = this->limbs + lVar28;
      uVar15 = *plVar27;
      *plVar27 = *plVar27 + uVar18;
      uVar18 = (ulong)CARRY8(uVar15,uVar18);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0x30);
  }
LAB_00df664d:
  if (uVar20 != 0) {
    uVar18 = 0x10d765;
    lVar28 = 0;
    do {
      plVar27 = this->limbs + lVar28;
      uVar20 = *plVar27;
      *plVar27 = *plVar27 + uVar18;
      uVar18 = (ulong)CARRY8(uVar20,uVar18);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 0x30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Num3072::Multiply(const Num3072& a)
{
    limb_t c0 = 0, c1 = 0, c2 = 0;
    Num3072 tmp;

    /* Compute limbs 0..N-2 of this*a into tmp, including one reduction. */
    for (int j = 0; j < LIMBS - 1; ++j) {
        limb_t d0 = 0, d1 = 0, d2 = 0;
        mul(d0, d1, this->limbs[1 + j], a.limbs[LIMBS + j - (1 + j)]);
        for (int i = 2 + j; i < LIMBS; ++i) muladd3(d0, d1, d2, this->limbs[i], a.limbs[LIMBS + j - i]);
        mulnadd3(c0, c1, c2, d0, d1, d2, MAX_PRIME_DIFF);
        for (int i = 0; i < j + 1; ++i) muladd3(c0, c1, c2, this->limbs[i], a.limbs[j - i]);
        extract3(c0, c1, c2, tmp.limbs[j]);
    }

    /* Compute limb N-1 of a*b into tmp. */
    assert(c2 == 0);
    for (int i = 0; i < LIMBS; ++i) muladd3(c0, c1, c2, this->limbs[i], a.limbs[LIMBS - 1 - i]);
    extract3(c0, c1, c2, tmp.limbs[LIMBS - 1]);

    /* Perform a second reduction. */
    muln2(c0, c1, MAX_PRIME_DIFF);
    for (int j = 0; j < LIMBS; ++j) {
        addnextract2(c0, c1, tmp.limbs[j], this->limbs[j]);
    }

    assert(c1 == 0);
    assert(c0 == 0 || c0 == 1);

    /* Perform up to two more reductions if the internal state has already
     * overflown the MAX of Num3072 or if it is larger than the modulus or
     * if both are the case.
     * */
    if (this->IsOverflow()) this->FullReduce();
    if (c0) this->FullReduce();
}